

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O1

void __thiscall
adios2::core::StructDefinition::AddField
          (StructDefinition *this,string *name,size_t offset,DataType type,size_t elementcount)

{
  pointer pSVar1;
  size_t sVar2;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string *local_38;
  
  local_38 = name;
  if (this->m_Frozen == true) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"core","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"VariableStruct::StructDefinition","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"AddField","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"struct definition already frozen","");
    helper::Throw<std::runtime_error>(&local_98,&local_b8,&local_58,&local_78,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if ((type & ~Struct) == None) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"core","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"VariableStruct::StructDefinition","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"AddField","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"invalid data type","");
    helper::Throw<std::invalid_argument>(&local_98,&local_b8,&local_58,&local_78,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  sVar2 = helper::GetDataTypeSize(type);
  if (this->m_StructSize < sVar2 * elementcount + offset) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"core","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"VariableStruct::StructDefinition","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"AddField","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"exceeded struct size","");
    helper::Throw<std::runtime_error>(&local_98,&local_b8,&local_58,&local_78,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  std::
  vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  ::emplace_back<>(&this->m_Definition);
  pSVar1 = (this->m_Definition).
           super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)(pSVar1 + -1));
  pSVar1[-1].Offset = offset;
  pSVar1[-1].Type = type;
  pSVar1[-1].ElementCount = elementcount;
  return;
}

Assistant:

void StructDefinition::AddField(const std::string &name, const size_t offset, const DataType type,
                                const size_t elementcount)
{
    if (m_Frozen)
    {
        helper::Throw<std::runtime_error>("core", "VariableStruct::StructDefinition", "AddField",
                                          "struct definition already frozen");
    }
    if (type == DataType::None || type == DataType::Struct)
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "AddField",
                                             "invalid data type");
    }
    if (offset + helper::GetDataTypeSize(type) * elementcount > m_StructSize)
    {
        helper::Throw<std::runtime_error>("core", "VariableStruct::StructDefinition", "AddField",
                                          "exceeded struct size");
    }
    m_Definition.emplace_back();
    auto &d = m_Definition.back();
    d.Name = name;
    d.Offset = offset;
    d.Type = type;
    d.ElementCount = elementcount;
}